

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall
CFFPrimitiveReader::ReadCard16(CFFPrimitiveReader *this,unsigned_short *outValue)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EStatusCode EVar3;
  ushort uVar4;
  bool bVar5;
  Byte buffer;
  Byte buffer_1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (this->mInternalState == eFailure) {
    uVar4 = 0;
    bVar5 = false;
  }
  else {
    iVar2 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mCFFFile,(long)&uStack_28 + 6,1);
    bVar5 = CONCAT44(extraout_var,iVar2) == 1;
    if (!bVar5) {
      this->mInternalState = eFailure;
    }
    uVar4 = (ushort)uStack_28._6_1_ << 8;
  }
  EVar3 = eFailure;
  if (bVar5) {
    if (this->mInternalState == eFailure) {
      uVar1 = 0;
      bVar5 = false;
    }
    else {
      iVar2 = (*(this->mCFFFile->super_IByteReader)._vptr_IByteReader[2])
                        (this->mCFFFile,(long)&uStack_28 + 7,1);
      bVar5 = CONCAT44(extraout_var_00,iVar2) == 1;
      if (!bVar5) {
        this->mInternalState = eFailure;
      }
      uVar1 = (ushort)uStack_28._7_1_;
    }
    if (bVar5) {
      *outValue = uVar1 | uVar4;
      EVar3 = eSuccess;
    }
  }
  return EVar3;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadCard16(unsigned short& outValue)
{
	Byte byte1,byte2;

	if(ReadByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;


	outValue = ((unsigned short)byte1 << 8) + byte2;

	return PDFHummus::eSuccess;

}